

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

type fmt::v5::
     visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>,fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
               (arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                *vis,basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
                     *arg)

{
  handle handle;
  basic_string_view<char> value;
  arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *paVar1;
  custom_value<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_RDX;
  char *pcVar2;
  arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_RSI;
  arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_RDI;
  type tVar3;
  iterator iVar4;
  iterator iVar5;
  type tVar6;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  double in_stack_ffffffffffffffb0;
  arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffca;
  arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_stack_ffffffffffffffd8;
  
  paVar1 = (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
            *)(ulong)*(uint *)&in_RDX[1].value;
  switch(paVar1) {
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0x0:
  default:
switchD_00272370_default:
    iVar5 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
            ::operator()(in_RDI,in_RSI);
    pcVar2 = iVar5._M_string;
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0x1:
    goto switchD_00272370_default;
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0x2:
    tVar3 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()(in_RDI,in_stack_ffffffffffffff94);
    pcVar2 = tVar3._M_string;
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0x3:
    tVar3 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()(in_RDI,in_stack_ffffffffffffff94);
    pcVar2 = tVar3._M_string;
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0x4:
    tVar3 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()(in_RDI,CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    pcVar2 = tVar3._M_string;
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0x5:
    tVar3 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()(in_RDI,CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    pcVar2 = tVar3._M_string;
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0x6:
    tVar3 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()(in_RDI,SUB41(in_stack_ffffffffffffff94 >> 0x18,0));
    pcVar2 = tVar3._M_string;
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0x7:
    tVar3 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()(paVar1,(char)((ulong)in_RDI >> 0x38));
    pcVar2 = tVar3._M_string;
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0x8:
    tVar3 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    pcVar2 = tVar3._M_string;
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0x9:
    tVar3 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
            ::operator()(in_stack_ffffffffffffffd8,
                         (longdouble)CONCAT28(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0));
    pcVar2 = tVar3._M_string;
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0xa:
    iVar5 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
            ::operator()(paVar1,(char_type *)in_RDI);
    pcVar2 = iVar5._M_string;
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0xb:
    basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)&stack0xffffffffffffffd8,(char *)in_RDX->value,
               (size_t)in_RDX->format);
    value.size_._0_2_ = in_stack_ffffffffffffffc8;
    value.data_ = (char *)in_stack_ffffffffffffffc0;
    value.size_._2_6_ = in_stack_ffffffffffffffca;
    iVar5 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
            ::operator()(in_stack_ffffffffffffffb8,value);
    pcVar2 = iVar5._M_string;
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0xc:
    iVar5 = internal::
            arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
            ::operator()(paVar1,in_RDI);
    pcVar2 = iVar5._M_string;
    break;
  case (arg_formatter_base<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
        *)0xd:
    paVar1 = in_RDI;
    basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
    ::handle::handle((handle *)&stack0xffffffffffffffc8,*in_RDX);
    handle.custom_.value._4_4_ = in_stack_ffffffffffffff94;
    handle.custom_.value._0_4_ = in_stack_ffffffffffffff90;
    handle.custom_.format =
         (_func_void_void_ptr_basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_ptr
          *)in_RDI;
    iVar4 = arg_formatter<fmt::v5::output_range<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
            ::operator()(in_RSI,handle);
    pcVar2 = iVar4._M_string;
    in_RDI = paVar1;
  }
  tVar6._M_string = pcVar2;
  tVar6._M_stream = (ostream_type *)in_RDI;
  return tVar6;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}